

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibi.cpp
# Opt level: O0

bool list_chibi_targets(char *build_root,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *library_targets,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *app_targets)

{
  ChibiLibrary *__x;
  bool bVar1;
  size_t *this;
  reference ppCVar2;
  ChibiLibrary *library;
  iterator __end1;
  iterator __begin1;
  vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *__range1;
  undefined1 local_88 [8];
  ChibiInfo chibi_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *app_targets_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *library_targets_local;
  char *build_root_local;
  
  chibi_info.cmake_module_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)app_targets;
  ChibiInfo::ChibiInfo((ChibiInfo *)local_88);
  bVar1 = chibi_process((ChibiInfo *)local_88,build_root,true,(char *)0x0);
  if (bVar1) {
    this = &chibi_info.build_targets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1 = std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::begin
                       ((vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *)this);
    library = (ChibiLibrary *)
              std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>::end
                        ((vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_> *)this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
                                  *)&library);
      if (!bVar1) break;
      ppCVar2 = __gnu_cxx::
                __normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
                ::operator*(&__end1);
      __x = *ppCVar2;
      if ((__x->isExecutable & 1U) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(library_targets,&__x->name);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)chibi_info.cmake_module_paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&__x->name);
      }
      __gnu_cxx::
      __normal_iterator<ChibiLibrary_**,_std::vector<ChibiLibrary_*,_std::allocator<ChibiLibrary_*>_>_>
      ::operator++(&__end1);
    }
    build_root_local._7_1_ = true;
  }
  else {
    build_root_local._7_1_ = false;
  }
  ChibiInfo::~ChibiInfo((ChibiInfo *)local_88);
  return build_root_local._7_1_;
}

Assistant:

bool list_chibi_targets(const char * build_root, std::vector<std::string> & library_targets, std::vector<std::string> & app_targets)
{
	ChibiInfo chibi_info;
	
	//
	
	if (chibi_process(chibi_info, build_root, true, nullptr) == false)
		return false;
	
	//
	
	for (auto * library : chibi_info.libraries)
	{
		if (library->isExecutable)
			app_targets.push_back(library->name);
		else
			library_targets.push_back(library->name);
	}
	
	return true;
}